

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcMapping.c
# Opt level: O2

void Sparc_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  long lVar1;
  hint_map *phVar2;
  undefined8 uVar3;
  unsigned_short uVar4;
  uint uVar5;
  cs_detail *pcVar6;
  long lVar7;
  
  uVar4 = insn_find(insns,0x1b9,id,&h->insn_cache);
  if (uVar4 != 0) {
    insn->id = (uint)insns[uVar4].mapid;
    if (h->detail != CS_OPT_OFF) {
      pcVar6 = insn->detail;
      *(undefined4 *)(pcVar6->regs_read + 8) = *(undefined4 *)(insns[uVar4].regs_use + 8);
      *(undefined8 *)pcVar6->regs_read = *(undefined8 *)insns[uVar4].regs_use;
      uVar5 = count_positive(insns[uVar4].regs_use);
      pcVar6 = insn->detail;
      pcVar6->regs_read_count = (uint8_t)uVar5;
      *(undefined4 *)(pcVar6->regs_write + 0x10) = *(undefined4 *)(insns[uVar4].regs_mod + 0x10);
      uVar3 = *(undefined8 *)(insns[uVar4].regs_mod + 8);
      *(undefined8 *)pcVar6->regs_write = *(undefined8 *)insns[uVar4].regs_mod;
      *(undefined8 *)(pcVar6->regs_write + 8) = uVar3;
      uVar5 = count_positive(insns[uVar4].regs_mod);
      pcVar6 = insn->detail;
      pcVar6->regs_write_count = (uint8_t)uVar5;
      *(undefined8 *)pcVar6->groups = *(undefined8 *)insns[uVar4].groups;
      uVar5 = count_positive(insns[uVar4].groups);
      pcVar6 = insn->detail;
      pcVar6->groups_count = (uint8_t)uVar5;
      if ((insns[uVar4].branch != false) || (insns[uVar4].indirect_branch == true)) {
        pcVar6->groups[uVar5 & 0xff] = '\x01';
        pcVar6 = insn->detail;
        pcVar6->groups_count = pcVar6->groups_count + '\x01';
      }
      lVar7 = 0;
      do {
        if (lVar7 == 0x12) {
          return;
        }
        lVar1 = lVar7 + 1;
        phVar2 = insn_hints + lVar7;
        lVar7 = lVar1;
      } while (phVar2->id != id);
      *(uint *)((long)&pcVar6->field_6 + 4) = (uint)(byte)"uge"[lVar1 * 8 + 3];
    }
  }
  return;
}

Assistant:

void Sparc_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	unsigned short i;

	i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = SPARC_GRP_JUMP;
				insn->detail->groups_count++;
			}
#endif
			// hint code
			for (i = 0; i < ARR_SIZE(insn_hints); i++) {
				if (id == insn_hints[i].id) {
					insn->detail->sparc.hint = insn_hints[i].hints;
					break;
				}
			}
		}
	}
}